

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::set_inc_term_func(raft_server *this,inc_term_func *func)

{
  element_type *peVar1;
  unique_lock<std::recursive_mutex> guard;
  _Any_data _Stack_48;
  code *local_38;
  unique_lock<std::recursive_mutex> local_28;
  
  local_28._M_device = &this->lock_;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  local_28._M_owns = true;
  peVar1 = (this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    std::function<unsigned_long_(unsigned_long)>::function
              ((function<unsigned_long_(unsigned_long)> *)&_Stack_48,func);
    std::function<unsigned_long_(unsigned_long)>::operator=
              (&peVar1->inc_term_cb_,(function<unsigned_long_(unsigned_long)> *)&_Stack_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&_Stack_48,&_Stack_48,__destroy_functor);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void raft_server::set_inc_term_func(srv_state::inc_term_func func) {
    recur_lock(lock_);
    if (!state_) return;
    state_->set_inc_term_func(func);
}